

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorPoolDatabase::FindFileContainingExtension
          (DescriptorPoolDatabase *this,string *containing_type,int field_number,
          FileDescriptorProto *output)

{
  Descriptor *pDVar1;
  FieldDescriptor *this_00;
  string *in_RCX;
  undefined4 in_EDX;
  FieldDescriptor *extension;
  Descriptor *extendee;
  undefined4 in_stack_00000028;
  FileDescriptorProto *in_stack_00000058;
  FileDescriptor *in_stack_00000060;
  FileDescriptorProto *in_stack_00000080;
  undefined4 in_stack_ffffffffffffffe0;
  undefined1 local_1;
  
  pDVar1 = DescriptorPool::FindMessageTypeByName
                     ((DescriptorPool *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RCX);
  if (pDVar1 == (Descriptor *)0x0) {
    local_1 = false;
  }
  else {
    this_00 = DescriptorPool::FindExtensionByNumber
                        ((DescriptorPool *)CONCAT44(field_number,in_stack_00000028),
                         (Descriptor *)output,extendee._4_4_);
    if (this_00 == (FieldDescriptor *)0x0) {
      local_1 = false;
    }
    else {
      FileDescriptorProto::Clear(in_stack_00000080);
      FieldDescriptor::file(this_00);
      FileDescriptor::CopyTo(in_stack_00000060,in_stack_00000058);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool DescriptorPoolDatabase::FindFileContainingExtension(
    const std::string& containing_type, int field_number,
    FileDescriptorProto* output) {
  const Descriptor* extendee = pool_.FindMessageTypeByName(containing_type);
  if (extendee == NULL) return false;

  const FieldDescriptor* extension =
      pool_.FindExtensionByNumber(extendee, field_number);
  if (extension == NULL) return false;

  output->Clear();
  extension->file()->CopyTo(output);
  return true;
}